

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O0

int mbedtls_chachapoly_update_aad(mbedtls_chachapoly_context *ctx,uchar *aad,size_t aad_len)

{
  size_t aad_len_local;
  uchar *aad_local;
  mbedtls_chachapoly_context *ctx_local;
  
  if (ctx->state == 1) {
    ctx->aad_len = aad_len + ctx->aad_len;
    ctx_local._4_4_ = mbedtls_poly1305_update(&ctx->poly1305_ctx,aad,aad_len);
  }
  else {
    ctx_local._4_4_ = -0x54;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_chachapoly_update_aad( mbedtls_chachapoly_context *ctx,
                                   const unsigned char *aad,
                                   size_t aad_len )
{
    CHACHAPOLY_VALIDATE_RET( ctx != NULL );
    CHACHAPOLY_VALIDATE_RET( aad_len == 0 || aad != NULL );

    if( ctx->state != CHACHAPOLY_STATE_AAD )
        return( MBEDTLS_ERR_CHACHAPOLY_BAD_STATE );

    ctx->aad_len += aad_len;

    return( mbedtls_poly1305_update( &ctx->poly1305_ctx, aad, aad_len ) );
}